

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::insert_node_before(xml_node_struct *child,xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *prev;
  xml_node_struct *parent;
  xml_node_struct *node_local;
  xml_node_struct *child_local;
  
  pxVar1 = node->parent;
  child->parent = pxVar1;
  pxVar2 = node->prev_sibling_c;
  if (pxVar2->next_sibling == (xml_node_struct *)0x0) {
    pxVar1->first_child = child;
  }
  else {
    pxVar2->next_sibling = child;
  }
  child->prev_sibling_c = pxVar2;
  child->next_sibling = node;
  node->prev_sibling_c = child;
  return;
}

Assistant:

inline void insert_node_before(xml_node_struct* child, xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		child->parent = parent;

		xml_node_struct* prev = node->prev_sibling_c;

		if (prev->next_sibling)
			prev->next_sibling = child;
		else
			parent->first_child = child;

		child->prev_sibling_c = prev;
		child->next_sibling = node;

		node->prev_sibling_c = child;
	}